

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::format_uint<3u,char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,int num_digits,bool upper)

{
  char *buffer_00;
  byte in_CL;
  int in_EDX;
  unsigned_long in_RSI;
  buffer<char> *in_RDI;
  char buffer [22];
  char *ptr;
  char *in_stack_ffffffffffffffa8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffc8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_8;
  
  to_unsigned<int>(in_EDX);
  buffer_00 = to_pointer<char>((buffer_appender<char>)in_stack_ffffffffffffffc8.container,
                               in_stack_ffffffffffffffc0);
  if (buffer_00 == (char *)0x0) {
    format_uint<3u,char,unsigned_long>(&stack0xffffffffffffffb8,in_RSI,in_EDX,(bool)(in_CL & 1));
    local_8.container =
         (buffer<char> *)
         copy_str<char,_char_*,_fmt::v7::detail::buffer_appender<char>,_0>
                   (in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8.container);
  }
  else {
    format_uint<3u,char,unsigned_long>(buffer_00,in_RSI,in_EDX,(bool)(in_CL & 1));
    local_8.container = in_RDI;
  }
  return (buffer_appender<char>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}